

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O0

void __thiscall cppcms::plugin::signature_error::signature_error(signature_error *this,string *msg)

{
  bad_cast *in_RSI;
  undefined8 *in_RDI;
  
  booster::bad_cast::bad_cast(in_RSI);
  *in_RDI = &PTR__signature_error_0052ffc8;
  in_RDI[1] = &PTR__signature_error_0052fff0;
  std::__cxx11::string::string((string *)(in_RDI + 5),(string *)in_RSI);
  return;
}

Assistant:

signature_error::signature_error(std::string const &msg) : msg_(msg) {}